

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eltwise.cpp
# Opt level: O0

int test_eltwise_1(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> a;
  Mat *in_stack_000006a0;
  int in_stack_000006ac;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_000006b0;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  uint uVar7;
  int in_stack_fffffffffffffd14;
  undefined1 *__n;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  byte bVar8;
  Mat local_200;
  byte local_1b9;
  Mat local_1b8;
  Mat local_178 [5];
  undefined1 local_21;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_20;
  uint local_4;
  
  __n = &local_21;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x116a89);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),(size_type)__n,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x116aaf);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd14);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,0);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  ncnn::Mat::~Mat((Mat *)0x116afd);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd14);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,1);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  ncnn::Mat::~Mat((Mat *)0x116b4c);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd14);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,2);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  ncnn::Mat::~Mat((Mat *)0x116b9b);
  RandomMat((int)((ulong)__n >> 0x20),(int)__n,in_stack_fffffffffffffd14);
  iVar6 = (int)((ulong)__n >> 0x20);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_20,3);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  ncnn::Mat::~Mat((Mat *)0x116bea);
  local_1b9 = 0;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar8 = 0;
  ncnn::Mat::Mat(local_178);
  iVar4 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
  uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd10);
  if (iVar4 == 0) {
    ncnn::Mat::Mat(&local_1b8);
    local_1b9 = 1;
    iVar5 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
    uVar7 = CONCAT13(1,(int3)uVar7);
    if (iVar5 == 0) {
      ncnn::Mat::Mat(&local_200);
      bVar3 = true;
      iVar5 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
      uVar7 = CONCAT13(1,(int3)uVar7);
      if (iVar5 == 0) {
        RandomMat(iVar6);
        bVar2 = true;
        iVar5 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
        uVar7 = CONCAT13(1,(int3)uVar7);
        if (iVar5 == 0) {
          RandomMat(iVar6);
          bVar1 = true;
          iVar5 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
          uVar7 = CONCAT13(1,(int3)uVar7);
          if (iVar5 == 0) {
            RandomMat(iVar6);
            bVar8 = 1;
            iVar6 = test_eltwise(in_stack_000006b0,in_stack_000006ac,in_stack_000006a0);
            uVar7 = CONCAT13(iVar6 != 0,(int3)uVar7);
          }
        }
      }
    }
  }
  local_4 = uVar7 >> 0x18;
  if ((bVar8 & 1) != 0) {
    ncnn::Mat::~Mat((Mat *)0x116dd1);
  }
  if (bVar1) {
    ncnn::Mat::~Mat((Mat *)0x116de4);
  }
  if (bVar2) {
    ncnn::Mat::~Mat((Mat *)0x116dfd);
  }
  if (bVar3) {
    ncnn::Mat::~Mat((Mat *)0x116e16);
  }
  if ((local_1b9 & 1) != 0) {
    ncnn::Mat::~Mat((Mat *)0x116e2f);
  }
  ncnn::Mat::~Mat((Mat *)0x116e3c);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)CONCAT44(iVar4,uVar7));
  return local_4;
}

Assistant:

static int test_eltwise_1()
{
    std::vector<ncnn::Mat> a(4);
    a[0] = RandomMat(7, 3, 5);
    a[1] = RandomMat(7, 3, 5);
    a[2] = RandomMat(7, 3, 5);
    a[3] = RandomMat(7, 3, 5);

    return 0
        || test_eltwise(a, 0, ncnn::Mat())
        || test_eltwise(a, 1, ncnn::Mat())
        || test_eltwise(a, 2, ncnn::Mat())

        || test_eltwise(a, 0, RandomMat(4))
        || test_eltwise(a, 1, RandomMat(4))
        || test_eltwise(a, 2, RandomMat(4))
        ;
}